

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::drawDecoration
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          QPixmap *pixmap)

{
  LayoutDirection direction;
  Alignment alignment;
  Int IVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  undefined1 local_58 [16];
  undefined1 *local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemDelegate).field_0x8;
  cVar3 = QIcon::isNull();
  if (cVar3 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QIcon::paint(lVar2 + 0xa8,painter,rect,
                   (option->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i,*(undefined4 *)(lVar2 + 0xb0),
                   *(undefined4 *)(lVar2 + 0xb4));
      return;
    }
  }
  else {
    cVar3 = QPixmap::isNull();
    if (((cVar3 == '\0') && ((rect->x1).m_i <= (rect->x2).m_i)) &&
       ((rect->y1).m_i <= (rect->y2).m_i)) {
      direction = (option->super_QStyleOption).direction;
      alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (option->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i;
      local_58._0_8_ = QPixmap::size();
      QVar4 = QStyle::alignedRect(direction,alignment,(QSize *)local_58,rect);
      local_40 = QVar4._0_8_;
      IVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      if ((short)IVar1 < 0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        selectedPixmap((QItemDelegate *)local_58,pixmap,&(option->super_QStyleOption).palette,
                       (bool)((byte)IVar1 & 1));
        QPainter::drawPixmap(painter,&local_40,(QPixmap *)local_58);
        QPixmap::~QPixmap((QPixmap *)local_58);
      }
      else {
        QPainter::drawPixmap(painter,&local_40,pixmap);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawDecoration(QPainter *painter, const QStyleOptionViewItem &option,
                                   const QRect &rect, const QPixmap &pixmap) const
{
    Q_D(const QItemDelegate);
    // if we have an icon, we ignore the pixmap
    if (!d->tmp.icon.isNull()) {
        d->tmp.icon.paint(painter, rect, option.decorationAlignment,
                          d->tmp.mode, d->tmp.state);
        return;
    }

    if (pixmap.isNull() || !rect.isValid())
        return;
    QPoint p = QStyle::alignedRect(option.direction, option.decorationAlignment,
                                   pixmap.size(), rect).topLeft();
    if (option.state & QStyle::State_Selected) {
        const QPixmap pm = selectedPixmap(pixmap, option.palette, option.state & QStyle::State_Enabled);
        painter->drawPixmap(p, pm);
    } else {
        painter->drawPixmap(p, pixmap);
    }
}